

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

natwm_error
button_handle_grab(natwm_state *state,xcb_button_press_event_t *event,xcb_rectangle_t *monitor_rect,
                  client *client)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  theme *ptVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint16_t uVar7;
  xcb_window_t xVar8;
  natwm_error nVar9;
  undefined4 uVar10;
  undefined8 local_50;
  undefined8 local_48;
  uint local_40;
  undefined8 local_3c;
  
  uVar10 = 0;
  if (event->same_screen == '\0') {
    internal_logger(natwm_logger,LEVEL_ERROR,
                    "Receieved a grab event which did not occur on the root window");
    nVar9 = INVALID_INPUT_ERROR;
  }
  else if (state->button_state->grabbed_client == (client *)0x0) {
    nVar9 = NO_ERROR;
    if (client->is_fullscreen == false) {
      natwm_state_lock(state);
      state->button_state->grabbed_client = client;
      state->button_state->monitor_rect = monitor_rect;
      state->button_state->start_x = event->event_x;
      state->button_state->start_y = event->event_y;
      natwm_state_unlock(state);
      if (event->detail == '\x03') {
        if (state->button_state->resize_helper == 0) {
          natwm_state_lock(state);
          xVar8 = xcb_generate_id(state->xcb);
          ptVar4 = state->workspace_list->theme;
          local_50 = CONCAT44(ptVar4->resize_border_color->color_value,
                              ptVar4->resize_background_color->color_value);
          local_48 = CONCAT44(local_48._4_4_,1);
          xcb_create_window(state->xcb,0,xVar8,state->screen->root,0xffffffffffffffff,0xffffffff,
                            CONCAT44(uVar10,1),1,0,0,state->screen->root_visual,0x20a,&local_50);
          xcb_icccm_set_wm_class(state->xcb,xVar8,0x22,"resize_helper_window");
          xcb_map_window(state->xcb,xVar8);
          xcb_flush(state->xcb);
          state->button_state->resize_helper = xVar8;
          natwm_state_unlock(state);
        }
        uVar7 = client_get_active_border_width(state->workspace_list->theme,client);
        uVar1._0_2_ = (client->rect).x;
        uVar1._2_2_ = (client->rect).y;
        auVar5 = vpmovsxwd_avx(ZEXT416(uVar1));
        uVar2._0_2_ = monitor_rect->x;
        uVar2._2_2_ = monitor_rect->y;
        auVar6 = vpmovsxwd_avx(ZEXT416(uVar2));
        auVar5 = vpaddd_avx(auVar6,auVar5);
        local_50 = auVar5._0_8_;
        uVar3._0_2_ = (client->rect).width;
        uVar3._2_2_ = (client->rect).height;
        auVar5 = vpmovzxwd_avx(ZEXT416(uVar3));
        local_48 = auVar5._0_8_;
        local_40 = (uint)uVar7;
        local_3c = 0;
        xcb_configure_window_aux(state->xcb,state->button_state->resize_helper,0x5f);
        xcb_flush(state->xcb);
      }
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Attempting to grab a second client");
    nVar9 = RESOLUTION_FAILURE;
  }
  return nVar9;
}

Assistant:

enum natwm_error button_handle_grab(struct natwm_state *state,
                                    const xcb_button_press_event_t *event,
                                    xcb_rectangle_t *monitor_rect, struct client *client)
{
        if (!event->same_screen) {
                LOG_ERROR(natwm_logger,
                          "Receieved a grab event which did not occur on the root window");

                return INVALID_INPUT_ERROR;
        }

        if (state->button_state->grabbed_client != NULL) {
                LOG_ERROR(natwm_logger, "Attempting to grab a second client");

                return RESOLUTION_FAILURE;
        }

        if (client->is_fullscreen) {
                // Ignore clients if they are currently fullscreen
                return NO_ERROR;
        }

        natwm_state_lock(state);

        state->button_state->grabbed_client = client;
        state->button_state->monitor_rect = monitor_rect;
        state->button_state->start_x = event->event_x;
        state->button_state->start_y = event->event_y;

        natwm_state_unlock(state);

        if (event->detail == XCB_BUTTON_INDEX_3) {
                initialize_resize_helper(state, monitor_rect, client);
        }

        return NO_ERROR;
}